

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O0

void __thiscall FDirectory::AddEntry(FDirectory *this,char *fullpath,int size)

{
  FString this_00;
  uint uVar1;
  size_t sVar2;
  FString local_48 [3];
  FString local_30;
  FString name;
  FDirectoryLump *lump_p;
  int size_local;
  char *fullpath_local;
  FDirectory *this_local;
  
  uVar1 = TArray<FDirectoryLump,_FDirectoryLump>::Reserve(&this->Lumps,1);
  name.Chars = (char *)TArray<FDirectoryLump,_FDirectoryLump>::operator[](&this->Lumps,(ulong)uVar1)
  ;
  FString::operator=(&((FDirectoryLump *)name.Chars)->mFullPath,fullpath);
  sVar2 = strlen((this->super_FResourceFile).Filename);
  FString::FString(&local_30,fullpath + sVar2);
  FString::ToLower(&local_30);
  this_00 = name;
  FString::FString(local_48,&local_30);
  FResourceLump::LumpNameSetup((FResourceLump *)this_00.Chars,local_48);
  FString::~FString(local_48);
  *(int *)(name.Chars + 8) = size;
  *(FDirectory **)(name.Chars + 0x38) = this;
  name.Chars[0x28] = '\0';
  FResourceLump::CheckEmbedded((FResourceLump *)name.Chars);
  FString::~FString(&local_30);
  return;
}

Assistant:

void FDirectory::AddEntry(const char *fullpath, int size)
{
	FDirectoryLump *lump_p = &Lumps[Lumps.Reserve(1)];

	// Store the full path here so that we can access the file later, even if it is from a filter directory.
	lump_p->mFullPath = fullpath;

	// [mxd] Convert name to lowercase
	FString name = fullpath + strlen(Filename);
	name.ToLower();

	// The lump's name is only the part relative to the main directory
	lump_p->LumpNameSetup(name);
	lump_p->LumpSize = size;
	lump_p->Owner = this;
	lump_p->Flags = 0;
	lump_p->CheckEmbedded();
}